

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall
ImageT<unsigned_char,_1U>::ImageT(ImageT<unsigned_char,_1U> *this,uint32_t w,uint32_t h)

{
  uint32_t p;
  Color *pCVar1;
  ulong uVar2;
  undefined8 *puVar3;
  
  (this->super_Image).width = w;
  (this->super_Image).height = h;
  (this->super_Image).transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
  (this->super_Image).primaries = KHR_DF_PRIMARIES_BT709;
  (this->super_Image)._vptr_Image = (_func_int **)&PTR__ImageT_001a8c60;
  pCVar1 = (Color *)malloc((ulong)h * (ulong)w);
  this->pixels = pCVar1;
  if (pCVar1 != (Color *)0x0) {
    this->freePixels = true;
    for (uVar2 = 0; h * w != uVar2; uVar2 = uVar2 + 1) {
      this->pixels[uVar2].field_0 = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0x0;
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = std::operator<<;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

ImageT(uint32_t w, uint32_t h) : Image(w, h)
    {
        size_t bytes = sizeof(Color) * w * h;
        pixels = (Color*)malloc(bytes);
        if (!pixels)
            throw std::bad_alloc();

        freePixels = true;

        for (uint32_t p = 0; p < w * h; ++p)
            for(uint32_t c = 0; c < componentCount; ++c)
                pixels[p].comps[c] = componentType{0};
    }